

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestUint64Conversions(void)

{
  uint64_t max_double64;
  uint64_t min_double64;
  uint64_t ordered;
  double in_stack_ffffffffffffffc8;
  Double in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  double expected;
  Double in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  int iVar1;
  Double in_stack_fffffffffffffff0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  double_conversion::Double::Double((Double *)&stack0xfffffffffffffff0,0x123456789abcdef);
  double_conversion::Double::value((Double *)0x86ad6c);
  CheckEqualsHelper((char *)in_stack_fffffffffffffff0.d64_,iVar1,
                    (char *)in_stack_ffffffffffffffe0.d64_,in_stack_ffffffffffffffd8,
                    (char *)in_stack_ffffffffffffffd0.d64_,in_stack_ffffffffffffffc8);
  iVar1 = 0;
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffe0,1);
  double_conversion::Double::value((Double *)0x86adb8);
  CheckEqualsHelper((char *)in_stack_fffffffffffffff0.d64_,iVar1,
                    (char *)in_stack_ffffffffffffffe0.d64_,in_stack_ffffffffffffffd8,
                    (char *)in_stack_ffffffffffffffd0.d64_,in_stack_ffffffffffffffc8);
  expected = 1.79769313486232e+308;
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffd0,0x7fefffffffffffff);
  double_conversion::Double::value((Double *)0x86ae0a);
  CheckEqualsHelper((char *)in_stack_fffffffffffffff0.d64_,iVar1,
                    (char *)in_stack_ffffffffffffffe0.d64_,expected,
                    (char *)in_stack_ffffffffffffffd0.d64_,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

TEST(Uint64Conversions) {
  // Start by checking the byte-order.
  uint64_t ordered = DOUBLE_CONVERSION_UINT64_2PART_C(0x01234567, 89ABCDEF);
  CHECK_EQ(3512700564088504e-318, Double(ordered).value());

  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK_EQ(5e-324, Double(min_double64).value());

  uint64_t max_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff);
  CHECK_EQ(1.7976931348623157e308, Double(max_double64).value());
}